

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileWatcherSync.hpp
# Opt level: O2

void __thiscall wmj::fileWatcherSync::~fileWatcherSync(fileWatcherSync *this)

{
  _Base_ptr p_Var1;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pair;
  undefined1 local_50 [40];
  
  for (p_Var1 = (this->wd_to_file_name)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->wd_to_file_name)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_50,
           (pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(p_Var1 + 1));
    remove_wd(this,local_50._0_4_);
    std::__cxx11::string::~string((string *)(local_50 + 8));
  }
  close(this->inotify_fd);
  this->inotify_fd = 0;
  if ((this->watch_thread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  std::thread::~thread(&this->watch_thread);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->change_file_list);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->wd_to_file_name)._M_t);
  return;
}

Assistant:

~fileWatcherSync() {
        for(auto pair : this->wd_to_file_name) {
            remove_wd(pair.first);
        }
        close(inotify_fd);
        // 停止文件监视线程
        inotify_fd = 0;
        if(watch_thread.joinable()) {
            watch_thread.join();
        }
    }